

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree_kv_test.cc
# Opt level: O0

void kv_ins_var(btree_kv_ops *kv_ops)

{
  _func_void_bnode_ptr_idx_t_void_ptr_void_ptr *p_Var1;
  long lVar2;
  char *pcVar3;
  char *pcVar4;
  idx_t iVar5;
  bnode *pbVar6;
  int iVar7;
  char *__s;
  char *pcVar8;
  ulong __n;
  char acStackY_a0 [8];
  char *local_98;
  char *k_out;
  char *key;
  uint64_t v_out;
  uint64_t value;
  idx_t idx;
  uint8_t vsize;
  bnode *pbStack_70;
  uint8_t ksize;
  bnoderef node;
  timeval __test_interval_ins;
  timeval __test_interval_total;
  timeval __test_cur;
  timeval __test_prev;
  timeval __test_begin;
  btree_kv_ops *kv_ops_local;
  
  acStackY_a0[0] = -0x74;
  acStackY_a0[1] = '+';
  acStackY_a0[2] = '\x10';
  acStackY_a0[3] = '\0';
  acStackY_a0[4] = '\0';
  acStackY_a0[5] = '\0';
  acStackY_a0[6] = '\0';
  acStackY_a0[7] = '\0';
  gettimeofday((timeval *)&__test_prev.tv_usec,(__timezone_ptr_t)0x0);
  acStackY_a0[0] = -0x67;
  acStackY_a0[1] = '+';
  acStackY_a0[2] = '\x10';
  acStackY_a0[3] = '\0';
  acStackY_a0[4] = '\0';
  acStackY_a0[5] = '\0';
  acStackY_a0[6] = '\0';
  acStackY_a0[7] = '\0';
  memleak_start();
  v_out = 10;
  value._7_1_ = 8;
  value._6_1_ = 8;
  acStackY_a0[0] = -0x45;
  acStackY_a0[1] = '+';
  acStackY_a0[2] = '\x10';
  acStackY_a0[3] = '\0';
  acStackY_a0[4] = '\0';
  acStackY_a0[5] = '\0';
  acStackY_a0[6] = '\0';
  acStackY_a0[7] = '\0';
  pbStack_70 = dummy_node(k_out._7_1_,k_out._6_1_,k_out._4_2_);
  __s = (char *)((long)&local_98 - (ulong)(value._7_1_ + 0xf & 0xfffffff0));
  lVar2 = -(ulong)(value._7_1_ + 0xf & 0xfffffff0);
  pcVar8 = __s + lVar2;
  __n = (ulong)value._7_1_;
  k_out = __s;
  local_98 = pcVar8;
  builtin_strncpy(__s + lVar2 + -8,"\v,\x10",4);
  pcVar8[-4] = '\0';
  pcVar8[-3] = '\0';
  pcVar8[-2] = '\0';
  pcVar8[-1] = '\0';
  memset(__s,0,__n);
  pcVar3 = k_out;
  builtin_strncpy(__s + lVar2 + -8,"\x1e,\x10",4);
  pcVar8[-4] = '\0';
  pcVar8[-3] = '\0';
  pcVar8[-2] = '\0';
  pcVar8[-1] = '\0';
  strcpy(pcVar3,"key");
  pbVar6 = pbStack_70;
  pcVar3 = k_out;
  value._4_2_ = 0;
  p_Var1 = kv_ops->ins_kv;
  builtin_strncpy(__s + lVar2 + -8,"D,\x10",4);
  pcVar8[-4] = '\0';
  pcVar8[-3] = '\0';
  pcVar8[-2] = '\0';
  pcVar8[-1] = '\0';
  (*p_Var1)(pbVar6,0,pcVar3,&v_out);
  pbVar6 = pbStack_70;
  iVar5 = value._4_2_;
  pcVar3 = local_98;
  p_Var1 = kv_ops->get_kv;
  builtin_strncpy(__s + lVar2 + -8,"c,\x10",4);
  pcVar8[-4] = '\0';
  pcVar8[-3] = '\0';
  pcVar8[-2] = '\0';
  pcVar8[-1] = '\0';
  (*p_Var1)(pbVar6,iVar5,pcVar3,&key);
  pcVar4 = k_out;
  pcVar3 = local_98;
  builtin_strncpy(__s + lVar2 + -8,"v,\x10",4);
  pcVar8[-4] = '\0';
  pcVar8[-3] = '\0';
  pcVar8[-2] = '\0';
  pcVar8[-1] = '\0';
  iVar7 = strcmp(pcVar3,pcVar4);
  if (iVar7 != 0) {
    pcVar8[-8] = -0x61;
    pcVar8[-7] = ',';
    pcVar8[-6] = '\x10';
    pcVar8[-5] = '\0';
    pcVar8[-4] = '\0';
    pcVar8[-3] = '\0';
    pcVar8[-2] = '\0';
    pcVar8[-1] = '\0';
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_kv_test.cc"
            ,0x167);
    pcVar4 = k_out;
    pcVar3 = local_98;
    kv_ins_var::__test_pass = 0;
    pcVar8[-8] = -0x44;
    pcVar8[-7] = ',';
    pcVar8[-6] = '\x10';
    pcVar8[-5] = '\0';
    pcVar8[-4] = '\0';
    pcVar8[-3] = '\0';
    pcVar8[-2] = '\0';
    pcVar8[-1] = '\0';
    iVar7 = strcmp(pcVar3,pcVar4);
    if (iVar7 != 0) {
      pcVar8[-8] = -0x15;
      pcVar8[-7] = ',';
      pcVar8[-6] = '\x10';
      pcVar8[-5] = '\0';
      pcVar8[-4] = '\0';
      pcVar8[-3] = '\0';
      pcVar8[-2] = '\0';
      pcVar8[-1] = '\0';
      __assert_fail("!(strcmp(k_out, key))",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_kv_test.cc"
                    ,0x167,"void kv_ins_var(btree_kv_ops *)");
    }
  }
  if (key != (char *)v_out) {
    builtin_strncpy(__s + lVar2 + -8,"\x1b-\x10",4);
    pcVar8[-4] = '\0';
    pcVar8[-3] = '\0';
    pcVar8[-2] = '\0';
    pcVar8[-1] = '\0';
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_kv_test.cc"
            ,0x168);
    kv_ins_var::__test_pass = 0;
    if (key != (char *)v_out) {
      builtin_strncpy(__s + lVar2 + -8,"P-\x10",4);
      pcVar8[-4] = '\0';
      pcVar8[-3] = '\0';
      pcVar8[-2] = '\0';
      pcVar8[-1] = '\0';
      __assert_fail("v_out == value",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_kv_test.cc"
                    ,0x168,"void kv_ins_var(btree_kv_ops *)");
    }
  }
  pbVar6 = pbStack_70;
  builtin_strncpy(__s + lVar2 + -8,"[-\x10",4);
  pcVar8[-4] = '\0';
  pcVar8[-3] = '\0';
  pcVar8[-2] = '\0';
  pcVar8[-1] = '\0';
  free(pbVar6);
  builtin_strncpy(__s + lVar2 + -8,"`-\x10",4);
  pcVar8[-4] = '\0';
  pcVar8[-3] = '\0';
  pcVar8[-2] = '\0';
  pcVar8[-1] = '\0';
  memleak_end();
  if (kv_ins_var::__test_pass == 0) {
    pcVar8[-8] = -0x57;
    pcVar8[-7] = '-';
    pcVar8[-6] = '\x10';
    pcVar8[-5] = '\0';
    pcVar8[-4] = '\0';
    pcVar8[-3] = '\0';
    pcVar8[-2] = '\0';
    pcVar8[-1] = '\0';
    fprintf(_stderr,"%s FAILED\n","kv_ins_var");
  }
  else {
    pcVar8[-8] = -0x78;
    pcVar8[-7] = '-';
    pcVar8[-6] = '\x10';
    pcVar8[-5] = '\0';
    pcVar8[-4] = '\0';
    pcVar8[-3] = '\0';
    pcVar8[-2] = '\0';
    pcVar8[-1] = '\0';
    fprintf(_stderr,"%s PASSED\n","kv_ins_var");
  }
  return;
}

Assistant:

void kv_ins_var(btree_kv_ops *kv_ops)
{
    TEST_INIT();
    memleak_start();

    bnoderef node;
    uint8_t ksize, vsize;
    idx_t idx;
    uint64_t value = 10;
    uint64_t v_out;

    ksize = 8;
    vsize = sizeof(value);
    node = dummy_node(ksize, vsize, 1);

    char *key = alca(char, ksize);
    char *k_out = alca(char, ksize);
    memset(key, 0x0, ksize);
    strcpy(key, "key");

    // insert key into to empty node
    idx = 0;
    kv_ops->ins_kv(node, idx, key, (void *)&value);

    // get and verify
    kv_ops->get_kv(node, idx, k_out, (void *)&v_out);
    TEST_CHK(!(strcmp(k_out, key)));
    TEST_CHK(v_out == value);

    free(node);
    memleak_end();
    TEST_RESULT("kv_ins_var");
}